

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  u16 *puVar1;
  sqlite3_io_methods *psVar2;
  unixShmNode *pShmNode;
  unixShm *puVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  unixShm **ppuVar6;
  ushort uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  
  psVar2 = fd[8].pMethods;
  pShmNode = *(unixShmNode **)psVar2;
  if (pShmNode->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pShmNode->mutex);
  }
  uVar8 = (1 << ((char)n + (byte)ofst & 0x1f)) + (-1 << ((byte)ofst & 0x1f));
  if ((flags & 1U) == 0) {
    ppuVar6 = &pShmNode->pFirst;
    if ((flags & 4U) == 0) {
      iVar5 = 5;
      while (puVar3 = *ppuVar6, puVar3 != (unixShm *)0x0) {
        if (((uVar8 & puVar3->exclMask) != 0) ||
           (ppuVar6 = &puVar3->pNext, (uVar8 & puVar3->sharedMask) != 0)) goto LAB_00123e5b;
      }
      iVar5 = unixShmSystemLock(pShmNode,1,ofst + 0x78,n);
      if (iVar5 == 0) {
        puVar1 = (u16 *)((long)&psVar2->xRead + 4);
        *puVar1 = *puVar1 | (ushort)uVar8;
        goto LAB_00123e3d;
      }
      goto LAB_00123e5b;
    }
    uVar7 = 0;
    iVar5 = 5;
    while (puVar3 = *ppuVar6, puVar3 != (unixShm *)0x0) {
      if ((uVar8 & puVar3->exclMask) != 0) goto LAB_00123e5b;
      uVar7 = uVar7 | puVar3->sharedMask;
      ppuVar6 = &puVar3->pNext;
    }
    if (((uVar8 & uVar7) == 0) && (iVar5 = unixShmSystemLock(pShmNode,0,ofst + 0x78,n), iVar5 != 0))
    goto LAB_00123e5b;
    puVar1 = (u16 *)((long)&psVar2->xRead + 2);
    *puVar1 = *puVar1 | (ushort)uVar8;
  }
  else {
    uVar7 = 0;
    ppuVar6 = &pShmNode->pFirst;
    while (psVar4 = (sqlite3_io_methods *)*ppuVar6, psVar4 != (sqlite3_io_methods *)0x0) {
      if (psVar4 != psVar2) {
        uVar7 = uVar7 | *(u16 *)((long)&psVar4->xRead + 2);
      }
      ppuVar6 = (unixShm **)&psVar4->xClose;
    }
    if (((uVar8 & uVar7) == 0) && (iVar5 = unixShmSystemLock(pShmNode,2,ofst + 0x78,n), iVar5 != 0))
    goto LAB_00123e5b;
    auVar9 = pshuflw(ZEXT416(~uVar8),ZEXT416(~uVar8),0);
    *(uint *)((long)&psVar2->xRead + 2) = auVar9._0_4_ & *(uint *)((long)&psVar2->xRead + 2);
  }
LAB_00123e3d:
  iVar5 = 0;
LAB_00123e5b:
  if (pShmNode->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(pShmNode->mutex);
  }
  return iVar5;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p = pDbFd->pShm;             /* The shared memory being locked */
  unixShm *pX;                          /* For looping over all siblings */
  unixShmNode *pShmNode = p->pShmNode;  /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->mutex);
  if( flags & SQLITE_SHM_UNLOCK ){
    u16 allMask = 0; /* Mask of locks held by siblings */

    /* See if any siblings hold this same lock */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( pX==p ) continue;
      assert( (pX->exclMask & (p->exclMask|p->sharedMask))==0 );
      allMask |= pX->sharedMask;
    }

    /* Unlock the system-level locks */
    if( (mask & allMask)==0 ){
      rc = unixShmSystemLock(pShmNode, F_UNLCK, ofst+UNIX_SHM_BASE, n);
    }else{
      rc = SQLITE_OK;
    }

    /* Undo the local locks */
    if( rc==SQLITE_OK ){
      p->exclMask &= ~mask;
      p->sharedMask &= ~mask;
    } 
  }else if( flags & SQLITE_SHM_SHARED ){
    u16 allShared = 0;  /* Union of locks held by connections other than "p" */

    /* Find out which shared locks are already held by sibling connections.
    ** If any sibling already holds an exclusive lock, go ahead and return
    ** SQLITE_BUSY.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
      allShared |= pX->sharedMask;
    }

    /* Get shared locks at the system level, if necessary */
    if( rc==SQLITE_OK ){
      if( (allShared & mask)==0 ){
        rc = unixShmSystemLock(pShmNode, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }else{
        rc = SQLITE_OK;
      }
    }

    /* Get the local shared locks */
    if( rc==SQLITE_OK ){
      p->sharedMask |= mask;
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 || (pX->sharedMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
    }
  
    /* Get the exclusive locks at the system level.  Then if successful
    ** also mark the local connection as being locked.
    */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pShmNode, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
      }
    }
  }
  sqlite3_mutex_leave(pShmNode->mutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, getpid(), p->sharedMask, p->exclMask));
  return rc;
}